

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

bool __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::IsCompatibleWith
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,
          IPipelineResourceSignature *pPRS)

{
  bool bVar1;
  Uint32 UVar2;
  Uint32 UVar3;
  PipelineResourceSignatureVkImpl *this_00;
  size_t sVar4;
  size_t sVar5;
  PipelineResourceSignatureDesc *Desc0;
  PipelineResourceSignatureDesc *Desc1;
  Char *Message;
  PipelineResourceAttribsType *this_01;
  PipelineResourceAttribsType *rhs;
  PipelineResourceAttribsType *OtherRes;
  PipelineResourceAttribsType *Res;
  Uint32 r;
  undefined1 local_58 [8];
  string msg;
  Uint32 ResCount;
  PipelineResourceSignatureImplType *Other;
  PipelineResourceSignatureImplType *This;
  IPipelineResourceSignature *pPRS_local;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this_local;
  
  if (pPRS == (IPipelineResourceSignature *)0x0) {
    this_local._7_1_ = IsEmpty(this);
  }
  else if (this == (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)pPRS) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = ClassPtrCast<Diligent::PipelineResourceSignatureVkImpl_const,Diligent::IPipelineResourceSignature_const>
                        (pPRS);
    sVar4 = GetHash(this);
    sVar5 = GetHash(&this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>);
    if (sVar4 == sVar5) {
      Desc0 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              ::GetDesc(&this->
                         super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                       );
      Desc1 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                         *)this_00);
      bVar1 = PipelineResourceSignaturesCompatible(Desc0,Desc1,false);
      if (bVar1) {
        UVar2 = GetTotalResourceCount(this);
        msg.field_2._12_4_ = UVar2;
        UVar3 = GetTotalResourceCount
                          (&this_00->
                            super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>);
        if (UVar2 != UVar3) {
          FormatString<char[26],char[42]>
                    ((string *)local_58,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"ResCount == Other.GetTotalResourceCount()",
                     (char (*) [42])(ulong)UVar3);
          Message = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (Message,"IsCompatibleWith",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                     ,0x266);
          std::__cxx11::string::~string((string *)local_58);
        }
        for (Res._0_4_ = 0; (uint)Res < (uint)msg.field_2._12_4_; Res._0_4_ = (uint)Res + 1) {
          this_01 = GetResourceAttribs(this,(uint)Res);
          rhs = GetResourceAttribs(&this_00->
                                    super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                                   ,(uint)Res);
          bVar1 = PipelineResourceAttribsVk::IsCompatibleWith(this_01,rhs);
          if (!bVar1) {
            return false;
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

IsCompatibleWith(const IPipelineResourceSignature* pPRS) const override final
    {
        if (pPRS == nullptr)
            return IsEmpty();

        if (this == pPRS)
            return true;

        const PipelineResourceSignatureImplType& This  = *static_cast<const PipelineResourceSignatureImplType*>(this);
        const PipelineResourceSignatureImplType& Other = *ClassPtrCast<const PipelineResourceSignatureImplType>(pPRS);

        if (This.GetHash() != Other.GetHash())
            return false;

        if (!PipelineResourceSignaturesCompatible(This.GetDesc(), Other.GetDesc()))
            return false;

        const Uint32 ResCount = This.GetTotalResourceCount();
        VERIFY_EXPR(ResCount == Other.GetTotalResourceCount());
        for (Uint32 r = 0; r < ResCount; ++r)
        {
            const PipelineResourceAttribsType& Res      = This.GetResourceAttribs(r);
            const PipelineResourceAttribsType& OtherRes = Other.GetResourceAttribs(r);
            if (!Res.IsCompatibleWith(OtherRes))
                return false;
        }

        return true;
    }